

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.h
# Opt level: O3

cmCommand * __thiscall cmSetPropertyCommand::Clone(cmSetPropertyCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(200);
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->Makefile = (cmMakefile *)0x0;
  pcVar1->Enabled = true;
  (pcVar1->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmSetPropertyCommand_0060d2b8;
  *(undefined4 *)&pcVar1[1].Makefile = 0;
  pcVar1[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar1[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&pcVar1[1].Makefile;
  pcVar1[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&pcVar1[1].Makefile;
  *(undefined8 *)&pcVar1[1].Enabled = 0;
  pcVar1[1].Error._M_dataplus._M_p = (pointer)&pcVar1[1].Error.field_2;
  pcVar1[1].Error._M_string_length = 0;
  pcVar1[1].Error.field_2._M_local_buf[0] = '\0';
  pcVar1[2].super_cmObject._vptr_cmObject = (_func_int **)&pcVar1[2].Helper;
  pcVar1[2].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &pcVar1[2].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined2 *)
   ((long)&pcVar1[2].Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined1 *)
   &pcVar1[2].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 1;
  return pcVar1;
}

Assistant:

virtual cmCommand* Clone()
    {
      return new cmSetPropertyCommand;
    }